

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O2

bool comparesEqual(QByteArray *lhs,QByteArrayView *rhs)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_data = (lhs->d).ptr;
  local_18.m_size = (lhs->d).size;
  bVar1 = comparesEqual(&local_18,rhs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

friend Qt::strong_ordering
    compareThreeWay(const QByteArray &lhs, const QByteArrayView &rhs) noexcept
    {
        const int res = QtPrivate::compareMemory(QByteArrayView(lhs), rhs);
        return Qt::compareThreeWay(res, 0);
    }